

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
ot::commissioner::Interpreter::NetworkSelectionComparator::NetworkSelectionComparator
          (NetworkSelectionComparator *this,Interpreter *aInterpreter)

{
  Status SVar1;
  Network nwk;
  Network local_70;
  
  this->mInterpreter = aInterpreter;
  persistent_storage::Network::Network(&local_70);
  SVar1 = persistent_storage::Registry::GetCurrentNetwork
                    ((this->mInterpreter->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_70);
  this->mSuccess = SVar1 == kSuccess;
  if (SVar1 == kSuccess) {
    this->mStartWith = local_70.mXpan;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.mMlp._M_dataplus._M_p != &local_70.mMlp.field_2) {
    operator_delete(local_70.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.mName._M_dataplus._M_p != &local_70.mName.field_2) {
    operator_delete(local_70.mName._M_dataplus._M_p);
  }
  return;
}

Assistant:

Interpreter::NetworkSelectionComparator::NetworkSelectionComparator(const Interpreter &aInterpreter)
    : mInterpreter(aInterpreter)
{
    Network        nwk;
    RegistryStatus status = mInterpreter.mRegistry->GetCurrentNetwork(nwk);

    mSuccess = status == RegistryStatus::kSuccess;
    if (mSuccess)
    {
        mStartWith = nwk.mXpan;
    }
}